

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  int in_EAX;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  undefined1 uVar14;
  byte bVar15;
  byte *local_38;
  
  lVar9 = (long)end - (long)ptr;
  if (lVar9 < 2) {
    return -1;
  }
  bVar3 = false;
  local_38 = (byte *)ptr;
LAB_00184483:
  bVar1 = *local_38;
  if (bVar1 < 0xdc) {
    uVar14 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar14 = *(undefined1 *)((long)enc[1].scanners + (ulong)local_38[1]);
      }
      else {
LAB_001844d6:
        uVar14 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar14 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (local_38[1] < 0xfe)) goto LAB_001844d6;
    uVar14 = 0;
  }
  switch(uVar14) {
  case 6:
    if (lVar9 == 2) {
      return -2;
    }
    break;
  case 7:
    if (lVar9 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    pcVar10 = end + (-2 - (long)local_38);
    pbVar7 = local_38;
    do {
      local_38 = pbVar7 + 2;
      iVar12 = 1;
      if ((long)pcVar10 < 2) {
        in_EAX = -1;
      }
      else {
        bVar1 = *local_38;
        if (bVar1 < 0xdc) {
          uVar13 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar7[3]);
            }
            else {
LAB_00184574:
              uVar13 = 0x1d;
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          uVar13 = 8;
        }
        else if ((bVar1 != 0xff) || (uVar13 = 0, pbVar7[3] < 0xfe)) goto LAB_00184574;
        iVar12 = 6;
        if ((uVar13 != 0xe) &&
           ((0x15 < uVar13 || (iVar12 = 0, (0x200600U >> (uVar13 & 0x1f) & 1) == 0)))) {
          *nextTokPtr = (char *)local_38;
          in_EAX = 0;
          iVar12 = 1;
        }
      }
      pcVar10 = pcVar10 + -2;
      pbVar7 = local_38;
    } while (iVar12 == 0);
    if (iVar12 != 6) {
      return in_EAX;
    }
  case 0xe:
    pbVar7 = local_38 + 2;
    for (lVar9 = (long)end - (long)pbVar7; 1 < lVar9; lVar9 = lVar9 + -2) {
      bVar1 = *pbVar7;
      if (bVar1 < 0xdc) {
        uVar13 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar7[1]);
          }
          else {
LAB_00184625:
            uVar13 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar13 = 8;
      }
      else if ((bVar1 != 0xff) || (uVar13 = 0, pbVar7[1] < 0xfe)) goto LAB_00184625;
      if ((uVar13 & 0xfffffffe) == 0xc) {
        local_38 = pbVar7 + 2;
        goto LAB_0018472c;
      }
      if ((0x15 < uVar13) || ((0x200600U >> (uVar13 & 0x1f) & 1) == 0)) goto LAB_00184a6a;
      pbVar7 = pbVar7 + 2;
    }
    in_EAX = -1;
    local_38 = pbVar7;
    goto LAB_00184669;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_001844f2_caseD_16;
  case 0x17:
    if (bVar3) break;
    pbVar7 = local_38 + 2;
    lVar9 = (long)end - (long)pbVar7;
    if (lVar9 < 2) {
      return -1;
    }
    bVar1 = *pbVar7;
    if (bVar1 < 0xdc) {
      bVar15 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar15 = *(byte *)((long)enc[1].scanners + (ulong)local_38[3]);
        }
        else {
LAB_001848f4:
          bVar15 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar15 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (local_38[3] < 0xfe)) goto LAB_001848f4;
      bVar15 = 0;
    }
    if (bVar15 < 0x16) {
      if (bVar15 != 5) {
        if (bVar15 == 6) {
          if (lVar9 == 2) {
            return -2;
          }
        }
        else if ((bVar15 == 7) && (lVar9 < 4)) {
          return -2;
        }
      }
LAB_00184b89:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    if (((bVar15 != 0x16) && (bVar15 != 0x18)) &&
       ((bVar15 != 0x1d ||
        ((*(uint *)((long)namingBitmap +
                   (ulong)(local_38[3] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
          >> (local_38[3] & 0x1f) & 1) == 0)))) goto LAB_00184b89;
    local_38 = local_38 + 4;
    bVar3 = true;
    goto LAB_00184675;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(local_38[1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5
                         )) >> (local_38[1] & 0x1f) & 1) == 0) break;
    goto switchD_001844f2_caseD_16;
  }
  *nextTokPtr = (char *)local_38;
  return 0;
switchD_001844f2_caseD_16:
  local_38 = local_38 + 2;
  goto LAB_00184675;
LAB_0018472c:
  do {
    lVar9 = (long)end - (long)local_38;
    iVar12 = -1;
    if (lVar9 < 2) {
LAB_001847be:
      iVar8 = 1;
    }
    else {
      bVar1 = *local_38;
      if (bVar1 < 0xdc) {
        uVar5 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_38[1]);
          }
          else {
LAB_00184793:
            uVar5 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar5 = 8;
      }
      else if ((bVar1 != 0xff) || (uVar5 = 0, local_38[1] < 0xfe)) goto LAB_00184793;
      iVar8 = 0xc;
      iVar12 = in_EAX;
      if (uVar5 != uVar13) {
        switch(uVar5) {
        case 0:
        case 1:
        case 2:
        case 8:
          *nextTokPtr = (char *)local_38;
          iVar12 = 0;
          goto LAB_001847be;
        case 3:
          iVar6 = big2_scanRef(enc,(char *)(local_38 + 2),end,(char **)&local_38);
          iVar8 = 0;
          if (iVar6 < 1) {
            if (iVar6 == 0) {
              *nextTokPtr = (char *)local_38;
            }
            iVar8 = 1;
            iVar12 = iVar6;
          }
          break;
        default:
          local_38 = local_38 + 2;
LAB_001847c9:
          iVar8 = 0;
          iVar12 = in_EAX;
          break;
        case 6:
          iVar8 = 1;
          iVar12 = -2;
          if (lVar9 != 2) {
            local_38 = local_38 + 3;
            goto LAB_001847c9;
          }
          break;
        case 7:
          iVar8 = 1;
          iVar12 = -2;
          if (3 < lVar9) {
            local_38 = local_38 + 4;
            goto LAB_001847c9;
          }
        }
      }
    }
    in_EAX = iVar12;
  } while (iVar8 == 0);
  if (iVar8 != 0xc) {
    bVar2 = false;
    goto LAB_0018466b;
  }
  pbVar7 = local_38 + 2;
  if ((long)end - (long)pbVar7 < 2) {
LAB_00184b02:
    local_38 = pbVar7;
    bVar2 = false;
    in_EAX = -1;
  }
  else {
    bVar1 = *pbVar7;
    if (bVar1 < 0xdc) {
      uVar13 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_38[3]);
        }
        else {
LAB_0018497c:
          uVar13 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar13 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (local_38[3] < 0xfe)) goto LAB_0018497c;
      uVar13 = 0;
    }
    if (uVar13 < 0x11) {
      if (uVar13 - 9 < 2) {
LAB_001849c0:
        uVar11 = (long)end - (long)(local_38 + 4);
        pbVar7 = local_38 + 4;
        if (1 < (long)uVar11) {
          pbVar4 = local_38 + 6;
LAB_001849dc:
          local_38 = pbVar4;
          bVar1 = local_38[-2];
          if (bVar1 < 0xdc) {
            uVar14 = 7;
            if (3 < bVar1 - 0xd8) {
              if (bVar1 == 0) {
                uVar14 = *(undefined1 *)((long)enc[1].scanners + (ulong)local_38[-1]);
              }
              else {
LAB_00184a2c:
                uVar14 = 0x1d;
              }
            }
          }
          else if (bVar1 - 0xdc < 4) {
            uVar14 = 8;
          }
          else {
            if ((bVar1 != 0xff) || (local_38[-1] < 0xfe)) goto LAB_00184a2c;
            uVar14 = 0;
          }
          switch(uVar14) {
          default:
            pbVar7 = local_38 + -2;
            goto LAB_00184a6a;
          case 6:
            if (uVar11 == 2) {
LAB_00184a93:
              local_38 = local_38 + -2;
              in_EAX = -2;
              goto LAB_00184669;
            }
            break;
          case 7:
            if (uVar11 < 4) goto LAB_00184a93;
            break;
          case 9:
          case 10:
          case 0x15:
            goto switchD_00184a42_caseD_9;
          case 0xb:
            local_38 = local_38 + -2;
            goto LAB_00184999;
          case 0x11:
            pbVar7 = local_38 + -2;
            goto LAB_00184aca;
          case 0x16:
          case 0x18:
            goto LAB_00184b3f;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(local_38[-1] >> 3 & 0x1c |
                                 (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
                 (local_38[-1] & 0x1f) & 1) == 0) {
              *nextTokPtr = (char *)(local_38 + -2);
              local_38 = local_38 + -2;
              goto LAB_00184a6d;
            }
LAB_00184b3f:
            bVar2 = true;
            goto LAB_0018466b;
          }
          in_EAX = 0;
          local_38 = local_38 + -2;
          *nextTokPtr = (char *)local_38;
          goto LAB_00184669;
        }
        goto LAB_00184b02;
      }
      local_38 = pbVar7;
      if (uVar13 == 0xb) {
LAB_00184999:
        *nextTokPtr = (char *)(local_38 + 2);
        in_EAX = 1;
LAB_00184669:
        bVar2 = false;
        goto LAB_0018466b;
      }
    }
    else if (uVar13 == 0x11) {
LAB_00184aca:
      local_38 = pbVar7;
      pbVar7 = local_38 + 2;
      if ((long)end - (long)pbVar7 < 2) goto LAB_00184b02;
      if ((*pbVar7 == 0) && (local_38[3] == 0x3e)) {
        *nextTokPtr = (char *)(local_38 + 4);
        in_EAX = 3;
        local_38 = pbVar7;
        goto LAB_00184669;
      }
    }
    else if (uVar13 == 0x15) goto LAB_001849c0;
LAB_00184a6a:
    local_38 = pbVar7;
    *nextTokPtr = (char *)local_38;
LAB_00184a6d:
    bVar2 = false;
    in_EAX = 0;
  }
LAB_0018466b:
  bVar3 = false;
  if (!bVar2) {
    return in_EAX;
  }
LAB_00184675:
  lVar9 = (long)end - (long)local_38;
  if (lVar9 < 2) {
    return -1;
  }
  goto LAB_00184483;
switchD_00184a42_caseD_9:
  uVar11 = uVar11 - 2;
  pbVar4 = local_38 + 2;
  pbVar7 = local_38;
  if ((long)uVar11 < 2) goto LAB_00184b02;
  goto LAB_001849dc;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}